

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

char * __thiscall Potassco::SmodelsConvert::getName(SmodelsConvert *this,Atom_t a)

{
  bool bVar1;
  pointer ppVar2;
  iterator it;
  unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
  *in_stack_ffffffffffffffc8;
  char *local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false> local_20;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false> local_18 [3];
  
  local_18[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x11ce4c);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::__detail::operator!=(local_18,&local_20);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_const_char_*>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_int,_const_char_*>,_false,_false> *
                        )0x11ce8d);
    local_30 = ppVar2->second;
  }
  else {
    local_30 = (char *)0x0;
  }
  return local_30;
}

Assistant:

const char* SmodelsConvert::getName(Atom_t a) const {
	SymTab::iterator it = data_->symTab_.find(a);
	return it != data_->symTab_.end() ? it->second : 0;
}